

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_function
          (Dispatch_Engine *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
          *f)

{
  bool bVar1;
  element_type *this_00;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *__x;
  const_reference type;
  ostream *poVar2;
  reference type_00;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_60;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_58;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_50;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_48;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  itr;
  undefined1 local_30 [8];
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> params;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
  *f_local;
  Dispatch_Engine *this_local;
  
  params.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)f;
  this_00 = std::
            __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&f->second);
  __x = dispatch::Proxy_Function_Base::get_param_types(this_00);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_30,__x);
  type = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::front
                   ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                    local_30);
  dump_type(this,type);
  poVar2 = std::operator<<((ostream *)&std::cout," ");
  poVar2 = std::operator<<(poVar2,(string *)
                                  params.
                                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar2,"(");
  local_50._M_current =
       (Type_Info *)
       std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::begin
                 ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_30)
  ;
  local_48 = __gnu_cxx::
             __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
             ::operator+(&local_50,1);
  while( true ) {
    local_58._M_current =
         (Type_Info *)
         std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::end
                   ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                    local_30);
    bVar1 = __gnu_cxx::
            operator==<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
                      (&local_48,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    type_00 = __gnu_cxx::
              __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
              ::operator*(&local_48);
    dump_type(this,type_00);
    __gnu_cxx::
    __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
    ::operator++(&local_48);
    local_60._M_current =
         (Type_Info *)
         std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::end
                   ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                    local_30);
    bVar1 = __gnu_cxx::
            operator==<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
                      (&local_48,&local_60);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::operator<<((ostream *)&std::cout,", ");
    }
  }
  std::operator<<((ostream *)&std::cout,") \n");
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_30);
  return;
}

Assistant:

void dump_function(const std::pair<const std::string, Proxy_Function> &f) const {
        const auto params = f.second->get_param_types();

        dump_type(params.front());
        std::cout << " " << f.first << "(";

        for (auto itr = params.begin() + 1; itr != params.end();) {
          dump_type(*itr);
          ++itr;

          if (itr != params.end()) {
            std::cout << ", ";
          }
        }

        std::cout << ") \n";
      }